

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

Error miniros::systemdNotify(char *status)

{
  int iVar1;
  size_t __n;
  char *pcVar2;
  size_t sVar3;
  ostream *poVar4;
  int *piVar5;
  Error_t EVar6;
  SmartFd fd;
  undefined1 local_9e [18];
  undefined8 local_8c;
  undefined8 uStack_84;
  undefined8 local_7c;
  undefined8 uStack_74;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 uStack_4c;
  undefined4 uStack_44;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined8 uStack_38;
  
  uStack_3c = 0;
  uStack_38 = 0;
  uStack_4c = 0;
  uStack_44 = 0;
  local_40 = 0;
  local_5c = 0;
  uStack_54 = 0;
  local_6c = 0;
  uStack_64 = 0;
  local_7c = 0;
  uStack_74 = 0;
  local_8c = 0;
  uStack_84 = 0;
  fd.fd = -1;
  local_9e._2_8_ = 0;
  local_9e._10_8_ = 0;
  local_9e._0_2_ = 1;
  EVar6 = Ok;
  if ((status == (char *)0x0) || (__n = strlen(status), __n == 0)) goto LAB_002186a6;
  pcVar2 = getenv("NOTIFY_SOCKET");
  if (pcVar2 == (char *)0x0) {
    poVar4 = std::operator<<((ostream *)&std::cerr,
                             "No NOTIFY_SOCKET variable was set. No systemd notification will be done."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    EVar6 = SystemError;
    goto LAB_002186a6;
  }
  EVar6 = Ok;
  if (((*pcVar2 != '@') && (*pcVar2 != '/')) || (sVar3 = strlen(pcVar2), 0x6b < sVar3))
  goto LAB_002186a6;
  memcpy(local_9e + 2,pcVar2,sVar3);
  if (local_9e[2] == '@') {
    local_9e._2_8_ = local_9e._2_8_ & 0xffffffffffffff00;
  }
  fd.fd = socket(1,0x80002,0);
  if (fd.fd < 0) {
    pcVar2 = "Failed to create sdnotify socket";
LAB_00218682:
    poVar4 = std::operator<<((ostream *)&std::cerr,pcVar2);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    iVar1 = connect(fd.fd,(sockaddr *)local_9e,(int)sVar3 + 2);
    if (iVar1 != 0) {
      pcVar2 = "Failed to connect sdnotify socket";
      goto LAB_00218682;
    }
    sVar3 = write(fd.fd,status,__n);
    EVar6 = Ok;
    if (sVar3 == __n) goto LAB_002186a6;
    poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to write sdnotify message");
    std::endl<char,std::char_traits<char>>(poVar4);
    if (-1 < (long)sVar3) goto LAB_002186a6;
  }
  piVar5 = __errno_location();
  EVar6 = (uint)(*piVar5 == 0) * 3;
LAB_002186a6:
  SmartFd::~SmartFd(&fd);
  return (Error)EVar6;
}

Assistant:

static int portableSystemdNotify(const char *message) {

  union sockaddr_union {
    struct sockaddr sa;
    struct sockaddr_un sun;
  } socket_addr = {};

  socket_addr.sun.sun_family = AF_UNIX;

  size_t path_length, message_length;
  SmartFd fd;

  const char *socket_path;

  /* Verify the argument first */
  if (!message)
    return -EINVAL;

  message_length = strlen(message);
  if (message_length == 0)
    return -EINVAL;

  /* If the variable is not set, the protocol is a noop */
  socket_path = getenv("NOTIFY_SOCKET");
  if (!socket_path) {
    std::cerr << "No NOTIFY_SOCKET variable was set. No systemd notification will be done." << std::endl;
    return 0; /* Not set? Nothing to do */
  }

  /* Only AF_UNIX is supported, with path or abstract sockets */
  if (socket_path[0] != '/' && socket_path[0] != '@')
    return -EAFNOSUPPORT;

  path_length = strlen(socket_path);
  /* Ensure there is room for NUL byte */
  if (path_length >= sizeof(socket_addr.sun.sun_path))
    return -E2BIG;

  memcpy(socket_addr.sun.sun_path, socket_path, path_length);

  /* Support for abstract socket */
  if (socket_addr.sun.sun_path[0] == '@')
    socket_addr.sun.sun_path[0] = 0;

  fd.fd = socket(AF_UNIX, SOCK_DGRAM|SOCK_CLOEXEC, 0);
  if (fd < 0) {
    std::cerr << "Failed to create sdnotify socket" << std::endl;
    return -errno;
  }

  if (connect(fd, &socket_addr.sa, offsetof(struct sockaddr_un, sun_path) + path_length) != 0) {
    std::cerr << "Failed to connect sdnotify socket" << std::endl;
    return -errno;
  }

  ssize_t written = write(fd, message, message_length);
  if (written != (ssize_t) message_length) {
    std::cerr << "Failed to write sdnotify message" << std::endl;
    return written < 0 ? -errno : -EPROTO;
  }

  return 1; /* Notified! */
}